

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_comment.cpp
# Opt level: O1

void __thiscall
Comment_SingleLineRowCounting_Test::TestBody(Comment_SingleLineRowCounting_Test *this)

{
  StrictMock<mock_json_callbacks> *this_00;
  FunctionMocker<std::error_code_()> *pFVar1;
  _func_int **pp_Var2;
  TypedExpectation<std::error_code_()> *pTVar3;
  TypedExpectation<std::error_code_(unsigned_long)> *this_01;
  _func_int **pp_Var4;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_02;
  pointer *__ptr;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  size_type __dnew;
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  undefined1 local_120 [8];
  VTable *local_118;
  Buffer local_110 [2];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_100;
  coord local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  AssertHelper local_e8;
  string local_e0;
  undefined1 local_c0 [8];
  deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
  local_b8;
  int local_68;
  error_category *local_60;
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  coord local_28;
  
  this_00 = &(this->super_Comment).callbacks_;
  pFVar1 = &(this->super_Comment).callbacks_.super_mock_json_callbacks.gmock00_begin_array_50;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&pFVar1->super_UntypedFunctionMockerBase,this_00);
  local_c0 = (undefined1  [8])pFVar1;
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                     ((MockSpec<std::error_code_()> *)local_c0,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_comment.cpp"
                      ,0x88,"callbacks_","begin_array ()");
  testing::internal::TypedExpectation<std::error_code_()>::Times(pTVar3,1);
  local_118 = (VTable *)
              &testing::internal::MatcherBase<unsigned_long>::
               GetVTable<testing::internal::MatcherBase<unsigned_long>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
               ::kVTable;
  local_120 = (undefined1  [8])&PTR__MatcherBase_001bdc68;
  mock_json_callbacks::gmock_uint64_value
            ((MockSpec<std::error_code_(unsigned_long)> *)local_c0,
             &this_00->super_mock_json_callbacks,(Matcher<unsigned_long> *)local_120);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<std::error_code_(unsigned_long)>::InternalExpectedAt
                      ((MockSpec<std::error_code_(unsigned_long)> *)local_c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_comment.cpp"
                       ,0x89,"callbacks_","uint64_value (_)");
  testing::internal::TypedExpectation<std::error_code_(unsigned_long)>::Times(this_01,2);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&local_b8);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)local_120);
  pFVar1 = &(this->super_Comment).callbacks_.super_mock_json_callbacks.gmock00_end_array_51;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&pFVar1->super_UntypedFunctionMockerBase,this_00);
  local_c0 = (undefined1  [8])pFVar1;
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                     ((MockSpec<std::error_code_()> *)local_c0,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_comment.cpp"
                      ,0x8a,"callbacks_","end_array ()");
  testing::internal::TypedExpectation<std::error_code_()>::Times(pTVar3,1);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_c0,
             (this->super_Comment).proxy_.original_,single_line_comments);
  pp_Var2 = (_func_int **)(local_120 + 0x10);
  local_e0._M_dataplus._M_p = (pointer)0x3f;
  local_120 = (undefined1  [8])pp_Var2;
  pp_Var4 = (_func_int **)std::__cxx11::string::_M_create((ulong *)local_120,(ulong)&local_e0);
  local_110[0].i = (int64_t)local_e0._M_dataplus._M_p;
  builtin_strncpy((char *)((long)pp_Var4 + 0x2f),"ment\n// ",8);
  builtin_strncpy((char *)((long)pp_Var4 + 0x37),"comment\n",8);
  pp_Var4[4] = (_func_int *)0x5d0a746e656d6d6f;
  pp_Var4[5] = (_func_int *)0x6d6d6f63202f2f20;
  pp_Var4[2] = (_func_int *)0x6e656d6d6f63202f;
  pp_Var4[3] = (_func_int *)0x63202f2f20320a74;
  *pp_Var4 = (_func_int *)0x6d6d6f632f2f205b;
  pp_Var4[1] = (_func_int *)0x2f202c310a746e65;
  local_118 = (VTable *)local_e0._M_dataplus._M_p;
  *(char *)((long)pp_Var4 + (long)local_e0._M_dataplus._M_p) = '\0';
  local_120 = (undefined1  [8])pp_Var4;
  pstore::gsl::details::extent_type<-1L>::extent_type
            ((extent_type<_1L> *)&local_e0,(index_type)local_e0._M_dataplus._M_p);
  local_e0._M_string_length = (size_type)pp_Var4;
  this_02 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>>::
            input<pstore::gsl::span<char_const,_1l>>
                      ((parser<callbacks_proxy<mock_json_callbacks>> *)local_c0,
                       (span<const_char,__1L> *)&local_e0);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_02);
  if (local_120 != (undefined1  [8])pp_Var2) {
    operator_delete((void *)local_120,(ulong)(local_110[0].i + 1));
  }
  local_f8.column._0_1_ = local_68 == 0;
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_68 != 0) {
    testing::Message::Message((Message *)&local_100);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_100._M_head_impl + 0x10),"JSON error was: ",0x10);
    (**(code **)(*(long *)local_60 + 0x20))(local_120,local_60,local_68);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_100._M_head_impl + 0x10),(char *)local_120,(long)local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e0,(internal *)&local_f8,(AssertionResult *)"p.has_error ()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_comment.cpp"
               ,0x95,local_e0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if (local_120 != (undefined1  [8])pp_Var2) {
      operator_delete((void *)local_120,(ulong)(local_110[0].i + 1));
    }
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_e0._M_dataplus._M_p = (pointer)local_28;
  local_f8.column = 1;
  local_f8.row = 6;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)local_120,"p.coordinate ()","(json::coord{1, 6})",(coord *)&local_e0,
             &local_f8);
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_118 == (VTable *)0x0) {
      message = "";
    }
    else {
      message = ((_Alloc_hider *)&local_118->match_and_explain)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_comment.cpp"
               ,0x96,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if ((coord)local_e0._M_dataplus._M_p != (coord)0x0) {
      (**(code **)(*(long *)local_e0._M_dataplus._M_p + 8))();
    }
  }
  if (local_118 != (VTable *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_120 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
  ::~deque(&local_b8);
  if ((_Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
       )local_c0 != (singleton_storage<callbacks_proxy<mock_json_callbacks>_> *)0x0) {
    operator_delete((void *)local_c0,0x68);
  }
  return;
}

Assistant:

TEST_F (Comment, SingleLineRowCounting) {
    using testing::_;
    EXPECT_CALL (callbacks_, begin_array ()).Times (1);
    EXPECT_CALL (callbacks_, uint64_value (_)).Times (2);
    EXPECT_CALL (callbacks_, end_array ()).Times (1);

    json::parser<decltype (proxy_)> p =
        json::make_parser (proxy_, json::extensions::single_line_comments);
    p.input (R"([ //comment
1, // comment
2 // comment
] // comment
// comment
)"s)
        .eof ();
    EXPECT_FALSE (p.has_error ()) << "JSON error was: " << p.last_error ().message ();
    EXPECT_EQ (p.coordinate (), (json::coord{1, 6}));
}